

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O2

void __thiscall i2p::sam::Session::CheckControlSock(Session *this)

{
  long lVar1;
  Sock *pSVar2;
  bool bVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock12;
  string errmsg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock12,&this->m_mutex,"m_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp"
             ,0x157,false);
  errmsg._M_dataplus._M_p = (pointer)&errmsg.field_2;
  errmsg._M_string_length = 0;
  errmsg.field_2._M_local_buf[0] = '\0';
  pSVar2 = (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
           super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
           super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  if (pSVar2 != (Sock *)0x0) {
    pbVar5 = &errmsg;
    iVar4 = (*pSVar2->_vptr_Sock[0x13])();
    if ((char)iVar4 == '\0') {
      bVar3 = ::LogAcceptCategory(NET,(Level)pbVar5);
      if (bVar3) {
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp"
        ;
        source_file._M_len = 0x57;
        logging_function._M_str = "CheckControlSock";
        logging_function._M_len = 0x10;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function,source_file,0x15b,I2P,Debug,(ConstevalFormatString<1U>)0x6ce155,
                   &errmsg);
      }
      Disconnect(this);
    }
  }
  std::__cxx11::string::~string((string *)&errmsg);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock12.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Session::CheckControlSock()
{
    LOCK(m_mutex);

    std::string errmsg;
    if (m_control_sock && !m_control_sock->IsConnected(errmsg)) {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Control socket error: %s\n", errmsg);
        Disconnect();
    }
}